

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_test.cc
# Opt level: O0

void __thiscall DSATest_ZeroPrivateKey_Test::TestBody(DSATest_ZeroPrivateKey_Test *this)

{
  allocator<unsigned_char> *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  BIGNUM *__p;
  pointer dsa_00;
  pointer priv_key;
  DSA *pDVar4;
  uchar *sig_00;
  char *in_R9;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__3;
  uint sig_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  AssertHelper local_e0;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIGNUM> zero;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<DSA> dsa;
  DSATest_ZeroPrivateKey_Test *this_local;
  
  GetFIPSDSA();
  testing::AssertionResult::AssertionResult<std::unique_ptr<dsa_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<dsa_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8b4ddd,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
               ,0x120,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    __p = BN_new();
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,(pointer)__p);
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_88,(AssertionResult *)0x81d092,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
                 ,0x122,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      dsa_00 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<dsa_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      priv_key = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::release
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_)
      ;
      local_cc = DSA_set0_key(dsa_00,(BIGNUM *)0x0,priv_key);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_c8,&local_cc,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(internal *)local_c8,
                   (AssertionResult *)"DSA_set0_key(dsa.get(), nullptr, zero.release())","false",
                   "true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
                   ,0x124,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string
                  ((string *)
                   &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (bVar1) {
        pDVar4 = (DSA *)std::unique_ptr<dsa_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<dsa_st,_bssl::internal::Deleter> *)
                                   &gtest_ar_.message_);
        iVar2 = DSA_size(pDVar4);
        this_00 = (allocator<unsigned_char> *)
                  ((long)&gtest_ar__3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  + 7);
        std::allocator<unsigned_char>::allocator(this_00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_len,(long)iVar2,
                   this_00);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&gtest_ar__3.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7));
        sig_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_len);
        pDVar4 = (DSA *)std::unique_ptr<dsa_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<dsa_st,_bssl::internal::Deleter> *)
                                   &gtest_ar_.message_);
        iVar2 = DSA_sign(0,"",0x20,sig_00,(uint *)&gtest_ar__3.message_,pDVar4);
        local_131 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_130,&local_131,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar1) {
          testing::Message::Message(&local_140);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_168,(internal *)local_130,
                     (AssertionResult *)
                     "DSA_sign(0, kZeroDigest, sizeof(kZeroDigest), sig.data(), &sig_len, dsa.get())"
                     ,"true","false",(char *)pDVar4);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
                     ,0x12a,pcVar3);
          testing::internal::AssertHelper::operator=(&local_148,&local_140);
          testing::internal::AssertHelper::~AssertHelper(&local_148);
          std::__cxx11::string::~string((string *)&local_168);
          testing::Message::~Message(&local_140);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_len);
      }
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<dsa_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(DSATest, ZeroPrivateKey) {
  bssl::UniquePtr<DSA> dsa = GetFIPSDSA();
  ASSERT_TRUE(dsa);
  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(zero);
  ASSERT_TRUE(DSA_set0_key(dsa.get(), /*pub_key=*/nullptr,
                           /*priv_key=*/zero.release()));

  static const uint8_t kZeroDigest[32] = {0};
  std::vector<uint8_t> sig(DSA_size(dsa.get()));
  unsigned sig_len;
  EXPECT_FALSE(DSA_sign(0, kZeroDigest, sizeof(kZeroDigest), sig.data(),
                        &sig_len, dsa.get()));
}